

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

bool __thiscall
boost::algorithm::
split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::equal(split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *Other)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  
  bVar1 = (this->
          super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).m_Finder.super_function_base.vtable == (vtable_base *)0x0 | this->m_bEof;
  bVar3 = (Other->
          super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).m_Finder.super_function_base.vtable == (vtable_base *)0x0 | Other->m_bEof;
  if (((bVar1 | bVar3) & 1) == 0) {
    bVar2 = range::
            equal<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                      (&this->m_Match,&Other->m_Match);
    if ((bVar2) && ((this->m_Next)._M_current == (Other->m_Next)._M_current)) {
      bVar1 = (this->m_End)._M_current == (Other->m_End)._M_current;
    }
    else {
      bVar1 = 0;
    }
  }
  else {
    bVar1 = bVar1 ^ bVar3 ^ 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool empty() const { return !vtable; }